

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

MIR_reg_t scan_var_to_var(gen_ctx_t gen_ctx,int scan_var)

{
  MIR_reg_t MVar1;
  size_t sVar2;
  
  if (gen_ctx->lr_ctx->scan_vars_num == 0) {
    return scan_var;
  }
  if (-1 < scan_var) {
    sVar2 = VARR_MIR_reg_tlength(gen_ctx->lr_ctx->scan_var_to_var_map);
    if (scan_var < (int)sVar2) {
      MVar1 = VARR_MIR_reg_tget(gen_ctx->lr_ctx->scan_var_to_var_map,(ulong)(uint)scan_var);
      return MVar1;
    }
  }
  __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
}

Assistant:

static MIR_reg_t scan_var_to_var (gen_ctx_t gen_ctx, int scan_var) {
  if (scan_vars_num == 0) return (MIR_reg_t) scan_var;
  gen_assert (scan_var >= 0 && (int) VARR_LENGTH (MIR_reg_t, scan_var_to_var_map) > scan_var);
  return VARR_GET (MIR_reg_t, scan_var_to_var_map, scan_var);
}